

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O0

void google::RawLog__(LogSeverity severity,char *file,int line,char *format,...)

{
  char cVar1;
  int iVar2;
  char **__src;
  char in_AL;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_ce8 [32];
  undefined8 local_cc8;
  undefined8 local_cc0;
  undefined8 local_cb8;
  undefined8 local_ca8;
  undefined8 local_c98;
  undefined8 local_c88;
  undefined8 local_c78;
  undefined8 local_c68;
  undefined8 local_c58;
  undefined8 local_c48;
  undefined1 local_c29;
  undefined1 local_c28 [7];
  bool no_chop;
  va_list ap;
  int msg_size;
  char *msg_start;
  char **ppcStack_bf0;
  int size;
  char *buf;
  char buffer [3000];
  char *format_local;
  int line_local;
  char *file_local;
  LogSeverity severity_local;
  
  if (in_AL != '\0') {
    local_cb8 = in_XMM0_Qa;
    local_ca8 = in_XMM1_Qa;
    local_c98 = in_XMM2_Qa;
    local_c88 = in_XMM3_Qa;
    local_c78 = in_XMM4_Qa;
    local_c68 = in_XMM5_Qa;
    local_c58 = in_XMM6_Qa;
    local_c48 = in_XMM7_Qa;
  }
  local_cc8 = in_R8;
  local_cc0 = in_R9;
  if (((((fLB::FLAGS_logtostderr & 1) != 0) || (fLI::FLAGS_stderrthreshold <= severity)) ||
      ((fLB::FLAGS_alsologtostderr & 1) != 0)) ||
     (bVar3 = glog_internal_namespace_::IsGoogleLoggingInitialized(), !bVar3)) {
    ppcStack_bf0 = &buf;
    msg_start._4_4_ = 3000;
    cVar1 = **(char **)(LogSeverityNames + (long)severity * 8);
    uVar4 = glog_internal_namespace_::GetTID();
    pcVar5 = glog_internal_namespace_::const_basename(file);
    DoRawLog((char **)&stack0xfffffffffffff410,(int *)((long)&msg_start + 4),
             "%c0000 00:00:00.000000 %5u %s:%d] RAW: ",(ulong)(uint)(int)cVar1,(ulong)uVar4,pcVar5,
             line);
    __src = ppcStack_bf0;
    iVar2 = msg_start._4_4_;
    ap[0].overflow_arg_area = local_ce8;
    ap[0]._0_8_ = &stack0x00000008;
    stack0xfffffffffffff3dc = 0x30;
    local_c28._0_4_ = 0x20;
    local_c29 = VADoRawLog((char **)&stack0xfffffffffffff410,(int *)((long)&msg_start + 4),format,
                           (__va_list_tag *)local_c28);
    if ((bool)local_c29) {
      DoRawLog((char **)&stack0xfffffffffffff410,(int *)((long)&msg_start + 4),"\n");
    }
    else {
      DoRawLog((char **)&stack0xfffffffffffff410,(int *)((long)&msg_start + 4),
               "RAW_LOG ERROR: The Message was too long!\n");
    }
    sVar6 = strlen((char *)&buf);
    syscall(1,2,&buf,sVar6);
    if (severity == 3) {
      bVar3 = glog_internal_namespace_::sync_val_compare_and_swap<bool>((bool *)&crashed,false,true)
      ;
      if (!bVar3) {
        crash_reason._0_8_ = file;
        crash_reason._8_4_ = line;
        memcpy(crash_buf,__src,(long)iVar2);
        crash_reason._16_8_ = crash_buf;
        crash_reason._280_4_ = GetStackTrace((void **)(crash_reason + 0x18),0x20,1);
        glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
      }
      LogMessage::Fail();
    }
  }
  return;
}

Assistant:

void RawLog__(LogSeverity severity, const char* file, int line,
              const char* format, ...) {
  if (!(FLAGS_logtostderr || severity >= FLAGS_stderrthreshold ||
        FLAGS_alsologtostderr || !IsGoogleLoggingInitialized())) {
    return;  // this stderr log message is suppressed
  }
  // can't call localtime_r here: it can allocate
  char buffer[kLogBufSize];
  char* buf = buffer;
  int size = sizeof(buffer);

  // NOTE: this format should match the specification in base/logging.h
  DoRawLog(&buf, &size, "%c0000 00:00:00.000000 %5u %s:%d] RAW: ",
           LogSeverityNames[severity][0],
           static_cast<unsigned int>(GetTID()),
           const_basename(const_cast<char *>(file)), line);

  // Record the position and size of the buffer after the prefix
  const char* msg_start = buf;
  const int msg_size = size;

  va_list ap;
  va_start(ap, format);
  bool no_chop = VADoRawLog(&buf, &size, format, ap);
  va_end(ap);
  if (no_chop) {
    DoRawLog(&buf, &size, "\n");
  } else {
    DoRawLog(&buf, &size, "RAW_LOG ERROR: The Message was too long!\n");
  }
  // We make a raw syscall to write directly to the stderr file descriptor,
  // avoiding FILE buffering (to avoid invoking malloc()), and bypassing
  // libc (to side-step any libc interception).
  // We write just once to avoid races with other invocations of RawLog__.
  safe_write(STDERR_FILENO, buffer, strlen(buffer));
  if (severity == GLOG_FATAL)  {
    if (!sync_val_compare_and_swap(&crashed, false, true)) {
      crash_reason.filename = file;
      crash_reason.line_number = line;
      memcpy(crash_buf, msg_start, msg_size);  // Don't include prefix
      crash_reason.message = crash_buf;
#ifdef HAVE_STACKTRACE
      crash_reason.depth =
          GetStackTrace(crash_reason.stack, ARRAYSIZE(crash_reason.stack), 1);
#else
      crash_reason.depth = 0;
#endif
      SetCrashReason(&crash_reason);
    }
    LogMessage::Fail();  // abort()
  }
}